

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int SaveEXR(float *data,int width,int height,int components,int save_as_fp16,char *outfilename,
           char **err)

{
  void *pvVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  EXRChannelInfo *__dest;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  float *pfVar8;
  size_type __new_size;
  vector<float,_std::allocator<float>_> images [4];
  float *image_ptr [4];
  EXRImage image;
  EXRHeader header;
  vector<float,_std::allocator<float>_> local_278;
  vector<float,_std::allocator<float>_> vStack_260;
  vector<float,_std::allocator<float>_> local_248;
  vector<float,_std::allocator<float>_> vStack_230;
  pointer local_218;
  pointer pfStack_210;
  pointer local_208;
  pointer pfStack_200;
  char *local_1f0;
  EXRImage local_1e8;
  undefined1 local_1b8 [104];
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int local_13c;
  int *local_138 [33];
  
  if (((uint)components < 5) && ((0x1aU >> (components & 0x1fU) & 1) != 0)) {
    local_1f0 = outfilename;
    memset(local_1b8,0,0x188);
    local_13c = 3;
    if (width < 0x10) {
      local_13c = (uint)(0xf < height) * 3;
    }
    __new_size = (long)height * (long)width;
    local_1e8.width = 0;
    local_1e8.height = 0;
    local_1e8.level_x = 0;
    local_1e8.level_y = 0;
    local_1e8.images = (uchar **)0x0;
    local_1e8.tiles = (EXRTile *)0x0;
    local_1e8.next_level = (TEXRImage *)0x0;
    local_1e8.num_tiles = 0;
    local_1e8.num_channels = components;
    vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (components == 1) {
      std::vector<float,_std::allocator<float>_>::resize(&local_278,__new_size);
      memcpy(local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,data,__new_size * 4);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(&local_278,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&vStack_260,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&local_248,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&vStack_230,__new_size);
      if (components == 4) {
        if (__new_size != 0) {
          pfVar8 = data + 3;
          lVar5 = 0;
          do {
            local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] = pfVar8[-3];
            vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] = pfVar8[-2];
            local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] = pfVar8[-1];
            vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] = *pfVar8;
            lVar5 = lVar5 + 1;
            pfVar8 = pfVar8 + 4;
          } while (__new_size - lVar5 != 0);
        }
      }
      else if (__new_size != 0) {
        pfVar8 = data + 2;
        lVar5 = 0;
        do {
          local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] = pfVar8[-2];
          vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] = pfVar8[-1];
          local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] = *pfVar8;
          lVar5 = lVar5 + 1;
          pfVar8 = pfVar8 + (uint)components;
        } while (__new_size - lVar5 != 0);
      }
    }
    local_208 = (pointer)0x0;
    pfStack_200 = (pointer)0x0;
    local_218 = (pointer)0x0;
    pfStack_210 = (pointer)0x0;
    if (components == 4) {
      if (((vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) ||
          (local_218 = vStack_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)) ||
         ((pfStack_210 = local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
          vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start ||
          (local_208 = vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)))) {
LAB_0010decb:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)local_138);
        _Unwind_Resume(uVar7);
      }
      pfStack_200 = local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else if (components == 3) {
      if (((local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) ||
          (local_218 = local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)) ||
         (pfStack_210 = vStack_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
         local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish ==
         local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_start)) goto LAB_0010decb;
      local_208 = local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    else if (components == 1) {
      if (local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010decb;
      local_218 = local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_1e8.images = (uchar **)&local_218;
    local_1e8.height = height;
    local_1e8.width = width;
    local_140 = components;
    __dest = (EXRChannelInfo *)malloc((ulong)(uint)(components * 0x110));
    local_150 = __dest;
    if (components == 4) {
      strncpy((char *)__dest,"A",0xff);
      strncpy(__dest[1].name,"B",0xff);
      strncpy(__dest[2].name,"G",0xff);
      strncpy(__dest[3].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      __dest[2].name[1] = '\0';
      lVar5 = 0x331;
    }
    else if (components == 3) {
      strncpy((char *)__dest,"B",0xff);
      strncpy(__dest[1].name,"G",0xff);
      strncpy(__dest[2].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      lVar5 = 0x221;
    }
    else {
      strncpy((char *)__dest,"A",0xff);
      lVar5 = 1;
    }
    __dest->name[lVar5] = '\0';
    lVar5 = (long)local_140;
    piVar6 = (int *)malloc(lVar5 << 2);
    local_148 = piVar6;
    local_138[0] = (int *)malloc(lVar5 << 2);
    if (0 < (long)local_140) {
      lVar5 = 0;
      do {
        piVar6[lVar5] = 2;
        local_138[0][lVar5] = (save_as_fp16 < 1) + 1;
        lVar5 = lVar5 + 1;
      } while (local_140 != lVar5);
    }
    iVar2 = SaveEXRImageToFile(&local_1e8,(EXRHeader *)local_1b8,local_1f0,err);
    free(local_150);
    free(local_148);
    free(local_138[0]);
    lVar5 = 0x48;
    do {
      pvVar1 = *(void **)((long)&local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar5);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1);
      }
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Unsupported component value : ",0x1e);
    plVar3 = (long *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),components);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar4 = strdup((char *)local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      *err = pcVar4;
    }
    if ((pointer *)
        local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)local_138);
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

int SaveEXR(const float *data, int width, int height, int components,
            const int save_as_fp16, const char *outfilename, const char **err) {
  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];
  const size_t pixel_count =
      static_cast<size_t>(width) * static_cast<size_t>(height);

  if (components == 1) {
    images[0].resize(pixel_count);
    memcpy(images[0].data(), data, sizeof(float) * pixel_count);
  } else {
    images[0].resize(pixel_count);
    images[1].resize(pixel_count);
    images[2].resize(pixel_count);
    images[3].resize(pixel_count);

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    if (components == 4) {
       for (size_t i = 0; i < pixel_count; i++) {
         images[0][i] = data[static_cast<size_t>(components) * i + 0];
         images[1][i] = data[static_cast<size_t>(components) * i + 1];
         images[2][i] = data[static_cast<size_t>(components) * i + 2];
         images[3][i] = data[static_cast<size_t>(components) * i + 3];
       }
    } else {
       for (size_t i = 0; i < pixel_count; i++) {
         images[0][i] = data[static_cast<size_t>(components) * i + 0];
         images[1][i] = data[static_cast<size_t>(components) * i + 1];
         images[2][i] = data[static_cast<size_t>(components) * i + 2];
       }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }

  int ret = SaveEXRImageToFile(&image, &header, outfilename, err);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return ret;
}